

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O0

void __thiscall
BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::~Timer
          (Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *this)

{
  long lVar1;
  long in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  allocator<char> local_49 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  allocator<char> *in_stack_ffffffffffffffd8;
  string *in_stack_ffffffffffffffe0;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RDI + 0x58) & 1) == 0) {
    in_stack_ffffffffffffff98 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffffe8,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8
              );
    Log(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    std::__cxx11::string::~string(in_stack_ffffffffffffff98);
    std::allocator<char>::~allocator(local_49);
  }
  else {
    tinyformat::format<std::__cxx11::string>
              ((char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    Log(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    std::__cxx11::string::~string(in_stack_ffffffffffffff98);
  }
  std::__cxx11::string::~string(in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~Timer()
    {
        if (m_message_on_completion) {
            this->Log(strprintf("%s completed", m_title));
        } else {
            this->Log("completed");
        }
    }